

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# testXdr.cpp
# Opt level: O2

void (anonymous_namespace)::check<char_const*>(istream *is,char *c)

{
  ostream *poVar1;
  int iVar2;
  char *pcVar3;
  char v [1024];
  
  pcVar3 = v;
  for (iVar2 = 0x400; -1 < iVar2; iVar2 = iVar2 + -1) {
    std::istream::read((char *)is,(long)pcVar3);
    if (*pcVar3 == '\0') break;
    pcVar3 = pcVar3 + 1;
  }
  poVar1 = std::operator<<((ostream *)&std::cout,"zero-terminated string: expected \"");
  poVar1 = std::operator<<(poVar1,c);
  poVar1 = std::operator<<(poVar1,"\", got \"");
  poVar1 = std::operator<<(poVar1,v);
  poVar1 = std::operator<<(poVar1,"\"");
  std::endl<char,std::char_traits<char>>(poVar1);
  iVar2 = strcmp(c,v);
  if (iVar2 == 0) {
    return;
  }
  __assert_fail("!strcmp (c, v)",
                "/workspace/llm4binary/github/license_c_cmakelists/AcademySoftwareFoundation[P]openexr/src/test/OpenEXRTest/testXdr.cpp"
                ,0x75,"void (anonymous namespace)::check(istream &, const char *)");
}

Assistant:

void
check (istream& is, const char* c)
{
    char v[1024];

    Xdr::read<CharIO> (is, sizeof (v), v);

    cout << "zero-terminated string: "
            "expected \""
         << c
         << "\", "
            "got \""
         << v << "\"" << endl;

    assert (!strcmp (c, v));
}